

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set_test.cc
# Opt level: O1

void __thiscall
leveldb::FindFileTest_OverlapSequenceChecks_Test::TestBody
          (FindFileTest_OverlapSequenceChecks_Test *this)

{
  undefined8 *puVar1;
  bool bVar2;
  internal iVar3;
  pointer *__ptr;
  char *in_R9;
  AssertionResult gtest_ar_;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_68;
  internal local_60 [8];
  undefined8 *local_58;
  AssertHelper local_50;
  string local_48;
  
  FindFileTest::Add(&this->super_FindFileTest,"200","200",5000,3000);
  bVar2 = FindFileTest::Overlaps(&this->super_FindFileTest,"199","199");
  local_60[0] = (internal)!bVar2;
  local_58 = (undefined8 *)0x0;
  if (!(bool)local_60[0]) {
    testing::Message::Message((Message *)&local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_48,local_60,(AssertionResult *)"!Overlaps(\"199\", \"199\")","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
               ,0x98,local_48._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    if (local_68._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_68._M_head_impl + 8))();
    }
  }
  puVar1 = local_58;
  if (local_58 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_58 != local_58 + 2) {
      operator_delete((undefined8 *)*local_58);
    }
    operator_delete(puVar1);
  }
  if (!bVar2) {
    bVar2 = FindFileTest::Overlaps(&this->super_FindFileTest,"201","300");
    local_60[0] = (internal)!bVar2;
    local_58 = (undefined8 *)0x0;
    if (!(bool)local_60[0]) {
      testing::Message::Message((Message *)&local_68);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_48,local_60,(AssertionResult *)"!Overlaps(\"201\", \"300\")","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
                 ,0x99,local_48._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p);
      }
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    puVar1 = local_58;
    if (local_58 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_58 != local_58 + 2) {
        operator_delete((undefined8 *)*local_58);
      }
      operator_delete(puVar1);
    }
    if (!bVar2) {
      iVar3 = (internal)FindFileTest::Overlaps(&this->super_FindFileTest,"200","200");
      local_58 = (undefined8 *)0x0;
      local_60[0] = iVar3;
      if (!(bool)iVar3) {
        testing::Message::Message((Message *)&local_68);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_48,local_60,(AssertionResult *)"Overlaps(\"200\", \"200\")","false","true"
                   ,in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
                   ,0x9a,local_48._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_68);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p);
        }
        if (local_68._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_68._M_head_impl + 8))();
        }
      }
      puVar1 = local_58;
      if (local_58 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_58 != local_58 + 2) {
          operator_delete((undefined8 *)*local_58);
        }
        operator_delete(puVar1);
      }
      if ((bool)iVar3) {
        iVar3 = (internal)FindFileTest::Overlaps(&this->super_FindFileTest,"190","200");
        local_58 = (undefined8 *)0x0;
        local_60[0] = iVar3;
        if (!(bool)iVar3) {
          testing::Message::Message((Message *)&local_68);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_48,local_60,(AssertionResult *)"Overlaps(\"190\", \"200\")","false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_50,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
                     ,0x9b,local_48._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_68);
          testing::internal::AssertHelper::~AssertHelper(&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_48._M_dataplus._M_p != &local_48.field_2) {
            operator_delete(local_48._M_dataplus._M_p);
          }
          if (local_68._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_68._M_head_impl + 8))();
          }
        }
        puVar1 = local_58;
        if (local_58 != (undefined8 *)0x0) {
          if ((undefined8 *)*local_58 != local_58 + 2) {
            operator_delete((undefined8 *)*local_58);
          }
          operator_delete(puVar1);
        }
        if ((bool)iVar3) {
          local_60[0] = (internal)FindFileTest::Overlaps(&this->super_FindFileTest,"200","210");
          local_58 = (undefined8 *)0x0;
          if (!(bool)local_60[0]) {
            testing::Message::Message((Message *)&local_68);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_48,local_60,(AssertionResult *)"Overlaps(\"200\", \"210\")","false",
                       "true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_50,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
                       ,0x9c,local_48._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_68);
            testing::internal::AssertHelper::~AssertHelper(&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_48._M_dataplus._M_p != &local_48.field_2) {
              operator_delete(local_48._M_dataplus._M_p);
            }
            if (local_68._M_head_impl !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              (**(code **)(*(long *)local_68._M_head_impl + 8))();
            }
          }
          puVar1 = local_58;
          if (local_58 != (undefined8 *)0x0) {
            if ((undefined8 *)*local_58 != local_58 + 2) {
              operator_delete((undefined8 *)*local_58);
            }
            operator_delete(puVar1);
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST_F(FindFileTest, OverlapSequenceChecks) {
  Add("200", "200", 5000, 3000);
  ASSERT_TRUE(!Overlaps("199", "199"));
  ASSERT_TRUE(!Overlaps("201", "300"));
  ASSERT_TRUE(Overlaps("200", "200"));
  ASSERT_TRUE(Overlaps("190", "200"));
  ASSERT_TRUE(Overlaps("200", "210"));
}